

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O3

void __thiscall ProcessProgress::parse(ProcessProgress *this,char *cmd)

{
  SharedControlBlock *pSVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  long lVar6;
  ulonglong uVar7;
  uint32_t size;
  uint32_t size_00;
  ulong uVar8;
  int *piVar9;
  uint uVar10;
  char *__format;
  size_t __n;
  void *__dest;
  bool bVar11;
  char *end;
  __node_gen_type __node_gen;
  epoll_event local_78;
  itimerspec local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar5 = strncmp(cmd,"CRASH",5);
  if (iVar5 == 0) {
    close_and_remove_epoll_entry(&this->timer_fd);
    iVar5 = timerfd_create(1,0x80000);
    this->timer_fd = iVar5;
    if (iVar5 < 0) {
      parse();
      return;
    }
    local_68.it_value.tv_nsec = 0;
    local_68.it_interval.tv_sec = 0;
    local_68.it_interval.tv_nsec = 0;
    local_68.it_value.tv_sec = 3;
    iVar5 = timerfd_settime(iVar5,0,&local_68,(itimerspec *)0x0);
    if (iVar5 < 0) {
      parse();
    }
    local_78.data.fd = 0;
    local_78._4_4_ = this->index | 0x80000000;
    local_78.events = 1;
    iVar5 = epoll_ctl(Global::epoll_fd,1,this->timer_fd,&local_78);
    if (iVar5 == 0) {
      return;
    }
    parse();
    return;
  }
  iVar5 = strncmp(cmd,"GRAPHICS_VERR",0xd);
  if (((iVar5 == 0) || (iVar5 = strncmp(cmd,"RAYTRACE_VERR",0xd), iVar5 == 0)) ||
     (iVar5 = strncmp(cmd,"COMPUTE_VERR",0xc), iVar5 == 0)) {
    pSVar1 = Global::control_block;
    if (Global::control_block == (SharedControlBlock *)0x0) {
      return;
    }
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_68.it_value.tv_sec = 0;
    local_68.it_value.tv_nsec = 0;
    local_68.it_interval.tv_sec = 0;
    local_68.it_interval.tv_nsec = 0;
    strcpy((char *)&local_68,cmd);
    piVar9 = &pSVar1->futex_lock;
    LOCK();
    iVar5 = *piVar9;
    bVar11 = iVar5 == 0;
    if (bVar11) {
      *piVar9 = 1;
      iVar5 = 0;
    }
    UNLOCK();
    if (!bVar11) {
      piVar9 = &pSVar1->futex_lock;
      do {
        if (iVar5 == 2) {
LAB_001336d4:
          syscall(0xca,piVar9,0,2,0,0,0);
        }
        else {
          LOCK();
          iVar5 = *piVar9;
          if (iVar5 == 1) {
            *piVar9 = 2;
            iVar5 = 1;
          }
          UNLOCK();
          if (iVar5 != 0) goto LAB_001336d4;
        }
        LOCK();
        iVar5 = *piVar9;
        bVar11 = iVar5 == 0;
        if (bVar11) {
          *piVar9 = 2;
          iVar5 = 0;
        }
        UNLOCK();
      } while (!bVar11);
    }
    pSVar1 = Global::control_block;
    uVar10 = Global::control_block->ring_buffer_size;
    if ((0x3f < uVar10) &&
       (Global::control_block->write_count + 0x40 <= Global::control_block->read_count + uVar10)) {
      __dest = (void *)((long)&Global::control_block->version_cookie +
                       (ulong)Global::control_block->ring_buffer_offset);
      uVar10 = uVar10 - Global::control_block->write_offset;
      __n = 0x40;
      if (uVar10 < 0x40) {
        __n = (size_t)uVar10;
      }
      memcpy((void *)((ulong)Global::control_block->write_offset + (long)__dest),&local_68,__n);
      if (uVar10 < 0x40) {
        memcpy(__dest,(void *)((long)&local_68.it_interval.tv_sec + __n),(ulong)(0x40 - (int)__n));
      }
      pSVar1->write_offset = pSVar1->ring_buffer_size - 1 & pSVar1->write_offset + 0x40;
      pSVar1->write_count = pSVar1->write_count + 0x40;
    }
    LOCK();
    piVar9 = &pSVar1->futex_lock;
    iVar5 = *piVar9;
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (iVar5 != 2) {
      return;
    }
    LOCK();
    pSVar1->futex_lock = 0;
    UNLOCK();
    syscall(0xca,&pSVar1->futex_lock,1,1,0,0,0);
    return;
  }
  iVar5 = strncmp(cmd,"GRAPHICS",8);
  if (iVar5 == 0) {
    local_78._0_8_ = (char *)0x0;
    lVar6 = strtol(cmd + 8,(char **)&local_78,0);
    this->graphics_progress = (int)lVar6;
    if ((char *)local_78._0_8_ == (char *)0x0) {
      return;
    }
    uVar7 = strtoull((char *)local_78._0_8_,(char **)0x0,0x10);
    if (Global::control_block == (SharedControlBlock *)0x0) {
      return;
    }
    if (uVar7 == 0 || this->graphics_progress < 1) {
      return;
    }
    uVar8 = (ulong)(this->graphics_progress - 1);
    __format = "GRAPHICS %d %lx\n";
  }
  else {
    iVar5 = strncmp(cmd,"RAYTRACE",8);
    if (iVar5 == 0) {
      local_78._0_8_ = (char *)0x0;
      lVar6 = strtol(cmd + 8,(char **)&local_78,0);
      this->raytracing_progress = (int)lVar6;
      if ((char *)local_78._0_8_ == (char *)0x0) {
        return;
      }
      uVar7 = strtoull((char *)local_78._0_8_,(char **)0x0,0x10);
      if (Global::control_block == (SharedControlBlock *)0x0) {
        return;
      }
      if (uVar7 == 0 || this->raytracing_progress < 1) {
        return;
      }
      uVar8 = (ulong)(this->raytracing_progress - 1);
      __format = "RAYTRACE %d %lx\n";
    }
    else {
      iVar5 = strncmp(cmd,"COMPUTE",7);
      if (iVar5 != 0) {
        iVar5 = strncmp(cmd,"MODULE_UUID",0xb);
        if (iVar5 == 0) {
          uVar2 = *(undefined8 *)(cmd + 0xc);
          uVar3 = *(undefined8 *)(cmd + 0x14);
          uVar4 = *(undefined8 *)(cmd + 0x24);
          *(undefined8 *)(this->module_uuid_path + 0x10) = *(undefined8 *)(cmd + 0x1c);
          *(undefined8 *)(this->module_uuid_path + 0x18) = uVar4;
          *(undefined8 *)this->module_uuid_path = uVar2;
          *(undefined8 *)(this->module_uuid_path + 8) = uVar3;
          return;
        }
        iVar5 = strncmp(cmd,"MODULE",6);
        if (iVar5 != 0) {
          iVar5 = strncmp(cmd,"BEGIN_HEARTBEAT",0xf);
          if (iVar5 == 0) {
            begin_heartbeat(this);
            return;
          }
          iVar5 = strncmp(cmd,"HEARTBEAT",9);
          if (iVar5 != 0) {
            parse((ProcessProgress *)cmd);
            return;
          }
          heartbeat(this);
          return;
        }
        local_78._0_8_ = strtoull(cmd + 6,(char **)0x0,0x10);
        local_68.it_interval.tv_sec = (__time_t)Global::faulty_spirv_modules;
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ();
        pSVar1 = Global::control_block;
        if (Global::control_block == (SharedControlBlock *)0x0) {
          return;
        }
        LOCK();
        (Global::control_block->banned_modules).super___atomic_base<unsigned_int>._M_i =
             (Global::control_block->banned_modules).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
        local_38 = 0;
        uStack_30 = 0;
        local_48 = 0;
        uStack_40 = 0;
        local_68.it_value.tv_sec = 0;
        local_68.it_value.tv_nsec = 0;
        local_68.it_interval.tv_sec = 0;
        local_68.it_interval.tv_nsec = 0;
        strcpy((char *)&local_68,cmd);
        ::Fossilize::futex_wrapper_lock(&pSVar1->futex_lock);
        pSVar1 = Global::control_block;
        ::Fossilize::shared_control_block_write(Global::control_block,&local_68,size_00);
        goto LAB_001339e9;
      }
      local_78._0_8_ = (char *)0x0;
      lVar6 = strtol(cmd + 7,(char **)&local_78,0);
      this->compute_progress = (int)lVar6;
      if ((char *)local_78._0_8_ == (char *)0x0) {
        return;
      }
      uVar7 = strtoull((char *)local_78._0_8_,(char **)0x0,0x10);
      if (Global::control_block == (SharedControlBlock *)0x0) {
        return;
      }
      if (uVar7 == 0 || this->compute_progress < 1) {
        return;
      }
      uVar8 = (ulong)(this->compute_progress - 1);
      __format = "COMPUTE %d %lx\n";
    }
  }
  sprintf((char *)&local_68,__format,uVar8,uVar7);
  ::Fossilize::futex_wrapper_lock(&Global::control_block->futex_lock);
  pSVar1 = Global::control_block;
  ::Fossilize::shared_control_block_write(Global::control_block,&local_68,size);
LAB_001339e9:
  ::Fossilize::futex_wrapper_unlock(&pSVar1->futex_lock);
  return;
}

Assistant:

void ProcessProgress::parse(const char *cmd)
{
	if (strncmp(cmd, "CRASH", 5) == 0)
	{
		// We crashed ... Set up a timeout in case the process hangs while trying to recover.
		close_and_remove_epoll_entry(timer_fd);
		timer_fd = timerfd_create(CLOCK_MONOTONIC, TFD_CLOEXEC);

		if (timer_fd >= 0)
		{
			struct itimerspec spec = {};
			spec.it_value.tv_sec = 3;
			if (timerfd_settime(timer_fd, 0, &spec, nullptr) < 0)
				LOGE("Failed to set time with timerfd_settime.\n");

			struct epoll_event event = {};
			event.data.u32 = 0x80000000u | index;
			event.events = EPOLLIN;
			if (epoll_ctl(Global::epoll_fd, EPOLL_CTL_ADD, timer_fd, &event))
				LOGE("Failed adding timer_fd to epoll_ctl().\n");
		}
		else
			LOGE("Failed to create timerfd. Cannot support timeout for process.\n");
	}
	else if (strncmp(cmd, "GRAPHICS_VERR", 13) == 0 ||
	         strncmp(cmd, "RAYTRACE_VERR", 13) == 0 ||
	         strncmp(cmd, "COMPUTE_VERR", 12) == 0)
	{
		if (Global::control_block)
		{
			// Just forward the message.
			char buffer[ControlBlockMessageSize] = {};
			strcpy(buffer, cmd);

			futex_wrapper_lock(&Global::control_block->futex_lock);
			shared_control_block_write(Global::control_block, buffer, sizeof(buffer));
			futex_wrapper_unlock(&Global::control_block->futex_lock);
		}
	}
	else if (strncmp(cmd, "GRAPHICS", 8) == 0)
	{
		char *end = nullptr;
		graphics_progress = int(strtol(cmd + 8, &end, 0));
		if (end)
		{
			Hash graphics_pipeline = strtoull(end, nullptr, 16);
			// graphics_progress tells us where to start on next iteration, but -1 was actually the pipeline index that crashed.
			if (Global::control_block && graphics_progress > 0 && graphics_pipeline != 0)
			{
				char buffer[ControlBlockMessageSize];
				sprintf(buffer, "GRAPHICS %d %" PRIx64 "\n", graphics_progress - 1, graphics_pipeline);
				futex_wrapper_lock(&Global::control_block->futex_lock);
				shared_control_block_write(Global::control_block, buffer, sizeof(buffer));
				futex_wrapper_unlock(&Global::control_block->futex_lock);
			}
		}
	}
	else if (strncmp(cmd, "RAYTRACE", 8) == 0)
	{
		char *end = nullptr;
		raytracing_progress = int(strtol(cmd + 8, &end, 0));
		if (end)
		{
			Hash raytracing_pipeline = strtoull(end, nullptr, 16);
			// raytracing_progress tells us where to start on next iteration, but -1 was actually the pipeline index that crashed.
			if (Global::control_block && raytracing_progress > 0 && raytracing_pipeline != 0)
			{
				char buffer[ControlBlockMessageSize];
				sprintf(buffer, "RAYTRACE %d %" PRIx64 "\n", raytracing_progress - 1, raytracing_pipeline);
				futex_wrapper_lock(&Global::control_block->futex_lock);
				shared_control_block_write(Global::control_block, buffer, sizeof(buffer));
				futex_wrapper_unlock(&Global::control_block->futex_lock);
			}
		}
	}
	else if (strncmp(cmd, "COMPUTE", 7) == 0)
	{
		char *end = nullptr;
		compute_progress = int(strtol(cmd + 7, &end, 0));
		if (end)
		{
			Hash compute_pipeline = strtoull(end, nullptr, 16);
			// compute_progress tells us where to start on next iteration, but -1 was actually the pipeline index that crashed.
			if (Global::control_block && compute_progress > 0 && compute_pipeline)
			{
				char buffer[ControlBlockMessageSize];
				sprintf(buffer, "COMPUTE %d %" PRIx64 "\n", compute_progress - 1, compute_pipeline);
				futex_wrapper_lock(&Global::control_block->futex_lock);
				shared_control_block_write(Global::control_block, buffer, sizeof(buffer));
				futex_wrapper_unlock(&Global::control_block->futex_lock);
			}
		}
	}
	else if (strncmp(cmd, "MODULE_UUID", 11) == 0)
	{
		memcpy(module_uuid_path, cmd + 12, VK_UUID_SIZE * 2);
	}
	else if (strncmp(cmd, "MODULE", 6) == 0)
	{
		auto hash = strtoull(cmd + 6, nullptr, 16);
		Global::faulty_spirv_modules.insert(hash);

		if (Global::control_block)
		{
			Global::control_block->banned_modules.fetch_add(1, std::memory_order_relaxed);
			char buffer[ControlBlockMessageSize] = {};
			strcpy(buffer, cmd);

			futex_wrapper_lock(&Global::control_block->futex_lock);
			shared_control_block_write(Global::control_block, buffer, sizeof(buffer));
			futex_wrapper_unlock(&Global::control_block->futex_lock);
		}
	}
	else if (strncmp(cmd, "BEGIN_HEARTBEAT", 15) == 0)
	{
		begin_heartbeat();
	}
	else if (strncmp(cmd, "HEARTBEAT", 9) == 0)
	{
		heartbeat();
	}
	else
		LOGE("Got unexpected message from child: %s\n", cmd);
}